

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  byte bVar1;
  path_type pVar2;
  undefined8 uVar3;
  byte in_DL;
  string *in_RSI;
  FileError *anon_var_0;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  path_type path_result;
  string *in_stack_000001d0;
  Config *in_stack_000001d8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = in_DL & 1;
  ::std::__cxx11::string::c_str();
  pVar2 = detail::check_path(in_stack_ffffffffffffffc8);
  if (pVar2 == file) {
    std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x166d25);
    Config::from_file(in_stack_000001d8,in_stack_000001d0);
    _parse_config((App *)CONCAT17(bVar1,CONCAT16(pVar2,in_stack_ffffffffffffffe0)),
                  in_stack_ffffffffffffffd8);
    local_1 = true;
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
              (in_stack_ffffffffffffff90);
  }
  else {
    if ((bVar1 & 1) != 0) {
      uVar3 = __cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&stack0xffffffffffffff90,in_RSI);
      FileError::Missing(in_stack_ffffffffffffffb8);
      __cxa_throw(uVar3,&FileError::typeinfo,FileError::~FileError);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}